

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void UYVYToYRow_C(uint8_t *src_uyvy,uint8_t *dst_y,int width)

{
  int x;
  int width_local;
  uint8_t *dst_y_local;
  uint8_t *src_uyvy_local;
  
  src_uyvy_local = src_uyvy;
  for (x = 0; x < width + -1; x = x + 2) {
    dst_y[x] = src_uyvy_local[1];
    dst_y[x + 1] = src_uyvy_local[3];
    src_uyvy_local = src_uyvy_local + 4;
  }
  if ((width & 1U) != 0) {
    dst_y[width + -1] = src_uyvy_local[1];
  }
  return;
}

Assistant:

void UYVYToYRow_C(const uint8_t* src_uyvy, uint8_t* dst_y, int width) {
  // Output a row of Y values.
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_y[x] = src_uyvy[1];
    dst_y[x + 1] = src_uyvy[3];
    src_uyvy += 4;
  }
  if (width & 1) {
    dst_y[width - 1] = src_uyvy[1];
  }
}